

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  BVH *bvh;
  size_t k;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  byte bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  float in_register_0000131c;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  float fVar17;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar18 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float in_register_0000135c;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  vfloat4 a0;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Precalculations pre;
  TravRayK<8,_true> tray;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_3c0;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined1 auStack_380 [352];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_220;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar13 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar4 = vpcmpeqd_avx(auVar13,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar13 = vpcmpeqd_avx(auVar13,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar4 = vpackssdw_avx(auVar4,auVar13);
    auVar13 = vpacksswb_avx(auVar4,auVar4);
    bVar6 = SUB161(auVar13 >> 7,0) & 1 | (SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (SUB161(auVar13 >> 0x17,0) & 1) << 2 | (SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (SUB161(auVar13 >> 0x27,0) & 1) << 4 | (SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (SUB161(auVar13 >> 0x37,0) & 1) << 6 | SUB161(auVar13 >> 0x3f,0) << 7;
    if (bVar6 != 0) {
      uVar9 = (ulong)bVar6;
      auVar1 = *(undefined1 (*) [32])(ray + 0x80);
      auVar2 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar3 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar11._0_4_ =
           auVar1._0_4_ * auVar1._0_4_ + auVar3._0_4_ * auVar3._0_4_ + auVar2._0_4_ * auVar2._0_4_;
      auVar11._4_4_ =
           auVar1._4_4_ * auVar1._4_4_ + auVar3._4_4_ * auVar3._4_4_ + auVar2._4_4_ * auVar2._4_4_;
      auVar11._8_4_ =
           auVar1._8_4_ * auVar1._8_4_ + auVar3._8_4_ * auVar3._8_4_ + auVar2._8_4_ * auVar2._8_4_;
      auVar11._12_4_ =
           auVar1._12_4_ * auVar1._12_4_ +
           auVar3._12_4_ * auVar3._12_4_ + auVar2._12_4_ * auVar2._12_4_;
      auVar11._16_4_ =
           auVar1._16_4_ * auVar1._16_4_ +
           auVar3._16_4_ * auVar3._16_4_ + auVar2._16_4_ * auVar2._16_4_;
      auVar11._20_4_ =
           auVar1._20_4_ * auVar1._20_4_ +
           auVar3._20_4_ * auVar3._20_4_ + auVar2._20_4_ * auVar2._20_4_;
      auVar11._24_4_ =
           auVar1._24_4_ * auVar1._24_4_ +
           auVar3._24_4_ * auVar3._24_4_ + auVar2._24_4_ * auVar2._24_4_;
      auVar11._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar5 = vrsqrtps_avx(auVar11);
      fVar17 = auVar5._0_4_;
      fVar23 = auVar5._4_4_;
      fVar24 = auVar5._8_4_;
      fVar25 = auVar5._12_4_;
      fVar26 = auVar5._16_4_;
      fVar27 = auVar5._20_4_;
      fVar28 = auVar5._24_4_;
      local_3c0.v[0] = fVar17 * 1.5 + fVar17 * fVar17 * fVar17 * auVar11._0_4_ * -0.5;
      local_3c0.v[1] = fVar23 * 1.5 + fVar23 * fVar23 * fVar23 * auVar11._4_4_ * -0.5;
      local_3c0.v[2] = fVar24 * 1.5 + fVar24 * fVar24 * fVar24 * auVar11._8_4_ * -0.5;
      local_3c0.v[3] = fVar25 * 1.5 + fVar25 * fVar25 * fVar25 * auVar11._12_4_ * -0.5;
      local_3c0.v[4] = fVar26 * 1.5 + fVar26 * fVar26 * fVar26 * auVar11._16_4_ * -0.5;
      local_3c0.v[5] = fVar27 * 1.5 + fVar27 * fVar27 * fVar27 * auVar11._20_4_ * -0.5;
      local_3c0.v[6] = fVar28 * 1.5 + fVar28 * fVar28 * fVar28 * auVar11._24_4_ * -0.5;
      local_3c0.v[7] = auVar11._28_4_ + 1.5;
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar18 = ZEXT816(0) << 0x20;
      uVar7 = uVar9;
      do {
        lVar8 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar8 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar8 * 4 + 0xa0)),0x1c);
        auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + lVar8 * 4 + 0xc0)),0x28);
        fVar17 = *(float *)((long)&local_3c0 + lVar8 * 4);
        auVar33._0_4_ = auVar32._0_4_ * fVar17;
        auVar33._4_4_ = auVar32._4_4_ * fVar17;
        auVar33._8_4_ = auVar32._8_4_ * fVar17;
        auVar33._12_4_ = auVar32._12_4_ * fVar17;
        auVar37 = vshufpd_avx(auVar33,auVar33,1);
        auVar32 = vmovshdup_avx(auVar33);
        auVar34 = vunpckhps_avx(auVar33,auVar18);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = (ulong)auVar32._0_4_ ^ 0x80000000;
        auVar35 = vshufps_avx(auVar34,auVar36,0x41);
        auVar34._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
        auVar34._8_8_ = auVar37._8_8_ ^ auVar13._8_8_;
        auVar34 = vinsertps_avx(auVar34,auVar33,0x2a);
        auVar32 = vdpps_avx(auVar35,auVar35,0x7f);
        auVar37 = vdpps_avx(auVar34,auVar34,0x7f);
        auVar32 = vcmpps_avx(auVar37,auVar32,1);
        auVar32 = vshufps_avx(auVar32,auVar32,0);
        auVar32 = vblendvps_avx(auVar34,auVar35,auVar32);
        auVar37 = vdpps_avx(auVar32,auVar32,0x7f);
        auVar34 = vrsqrtss_avx(auVar37,auVar37);
        fVar23 = auVar34._0_4_;
        auVar37 = ZEXT416((uint)(fVar23 * 1.5 - auVar37._0_4_ * 0.5 * fVar23 * fVar23 * fVar23));
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        auVar35._0_4_ = auVar32._0_4_ * auVar37._0_4_;
        auVar35._4_4_ = auVar32._4_4_ * auVar37._4_4_;
        auVar35._8_4_ = auVar32._8_4_ * auVar37._8_4_;
        auVar35._12_4_ = auVar32._12_4_ * auVar37._12_4_;
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar37 = vshufps_avx(auVar33,auVar33,0xc9);
        auVar39._0_4_ = auVar37._0_4_ * auVar35._0_4_;
        auVar39._4_4_ = auVar37._4_4_ * auVar35._4_4_;
        auVar39._8_4_ = auVar37._8_4_ * auVar35._8_4_;
        auVar39._12_4_ = auVar37._12_4_ * auVar35._12_4_;
        auVar37._0_4_ = auVar33._0_4_ * auVar32._0_4_;
        auVar37._4_4_ = auVar33._4_4_ * auVar32._4_4_;
        auVar37._8_4_ = auVar33._8_4_ * auVar32._8_4_;
        auVar37._12_4_ = auVar33._12_4_ * auVar32._12_4_;
        auVar32 = vsubps_avx(auVar37,auVar39);
        auVar34 = vshufps_avx(auVar32,auVar32,0xc9);
        auVar32 = vdpps_avx(auVar34,auVar34,0x7f);
        lVar8 = lVar8 * 0x30;
        auVar37 = vrsqrtss_avx(auVar32,auVar32);
        fVar23 = auVar37._0_4_;
        auVar32 = ZEXT416((uint)(fVar23 * 1.5 - auVar32._0_4_ * 0.5 * fVar23 * fVar23 * fVar23));
        auVar32 = vshufps_avx(auVar32,auVar32,0);
        auVar38._0_4_ = auVar32._0_4_ * auVar34._0_4_;
        auVar38._4_4_ = auVar32._4_4_ * auVar34._4_4_;
        auVar38._8_4_ = auVar32._8_4_ * auVar34._8_4_;
        auVar38._12_4_ = auVar32._12_4_ * auVar34._12_4_;
        auVar32._0_4_ = fVar17 * auVar33._0_4_;
        auVar32._4_4_ = fVar17 * auVar33._4_4_;
        auVar32._8_4_ = fVar17 * auVar33._8_4_;
        auVar32._12_4_ = fVar17 * auVar33._12_4_;
        auVar34 = vunpcklps_avx(auVar35,auVar32);
        auVar32 = vunpckhps_avx(auVar35,auVar32);
        auVar35 = vunpcklps_avx(auVar38,auVar18);
        auVar37 = vunpckhps_avx(auVar38,auVar18);
        auVar37 = vunpcklps_avx(auVar32,auVar37);
        auVar33 = vunpcklps_avx(auVar34,auVar35);
        auVar32 = vunpckhps_avx(auVar34,auVar35);
        *(undefined1 (*) [16])(local_3a0 + lVar8) = auVar33;
        *(undefined1 (*) [16])(auStack_390 + lVar8) = auVar32;
        *(undefined1 (*) [16])(auStack_380 + lVar8) = auVar37;
        uVar7 = uVar7 & uVar7 - 1;
      } while (uVar7 != 0);
      local_220._0_8_ = *(undefined8 *)ray;
      local_220._8_8_ = *(undefined8 *)(ray + 8);
      local_220._16_8_ = *(undefined8 *)(ray + 0x10);
      local_220._24_8_ = *(undefined8 *)(ray + 0x18);
      local_220._32_8_ = *(undefined8 *)(ray + 0x20);
      local_220._40_8_ = *(undefined8 *)(ray + 0x28);
      local_220._48_8_ = *(undefined8 *)(ray + 0x30);
      local_220._56_8_ = *(undefined8 *)(ray + 0x38);
      local_220._64_8_ = *(undefined8 *)(ray + 0x40);
      local_220._72_8_ = *(undefined8 *)(ray + 0x48);
      local_220._80_8_ = *(undefined8 *)(ray + 0x50);
      local_220._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar14._16_4_ = 0x7fffffff;
      auVar14._20_4_ = 0x7fffffff;
      auVar14._24_4_ = 0x7fffffff;
      auVar14._28_4_ = 0x7fffffff;
      auVar19._8_4_ = 0x219392ef;
      auVar19._0_8_ = 0x219392ef219392ef;
      auVar19._12_4_ = 0x219392ef;
      auVar19._16_4_ = 0x219392ef;
      auVar19._20_4_ = 0x219392ef;
      auVar19._24_4_ = 0x219392ef;
      auVar19._28_4_ = 0x219392ef;
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = &DAT_3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar29._16_4_ = 0x3f800000;
      auVar29._20_4_ = 0x3f800000;
      auVar29._24_4_ = 0x3f800000;
      auVar29._28_4_ = 0x3f800000;
      auVar12 = vdivps_avx(auVar29,auVar1);
      auVar5 = vandps_avx(auVar1,auVar14);
      auVar11 = vcmpps_avx(auVar5,auVar19,1);
      auVar5 = vandps_avx(auVar2,auVar14);
      auVar10 = vcmpps_avx(auVar5,auVar19,1);
      auVar15 = vdivps_avx(auVar29,auVar2);
      auVar5 = vandps_avx(auVar3,auVar14);
      auVar5 = vcmpps_avx(auVar5,auVar19,1);
      auVar14 = vdivps_avx(auVar29,auVar3);
      auVar30._8_4_ = 0x5d5e0b6b;
      auVar30._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar30._12_4_ = 0x5d5e0b6b;
      auVar30._16_4_ = 0x5d5e0b6b;
      auVar30._20_4_ = 0x5d5e0b6b;
      auVar30._24_4_ = 0x5d5e0b6b;
      auVar30._28_4_ = 0x5d5e0b6b;
      local_160 = vblendvps_avx(auVar12,auVar30,auVar11);
      local_140 = vblendvps_avx(auVar15,auVar30,auVar10);
      local_120 = vblendvps_avx(auVar14,auVar30,auVar5);
      auVar5 = vcmpps_avx(local_160,ZEXT832(0) << 0x20,1);
      auVar20._8_4_ = 0x20;
      auVar20._0_8_ = 0x2000000020;
      auVar20._12_4_ = 0x20;
      auVar20._16_4_ = 0x20;
      auVar20._20_4_ = 0x20;
      auVar20._24_4_ = 0x20;
      auVar20._28_4_ = 0x20;
      local_100 = vandps_avx(auVar5,auVar20);
      auVar5 = vcmpps_avx(local_140,ZEXT832(0) << 0x20,5);
      auVar21._8_4_ = 0x40;
      auVar21._0_8_ = 0x4000000040;
      auVar21._12_4_ = 0x40;
      auVar21._16_4_ = 0x40;
      auVar21._20_4_ = 0x40;
      auVar21._24_4_ = 0x40;
      auVar21._28_4_ = 0x40;
      auVar31._8_4_ = 0x60;
      auVar31._0_8_ = 0x6000000060;
      auVar31._12_4_ = 0x60;
      auVar31._16_4_ = 0x60;
      auVar31._20_4_ = 0x60;
      auVar31._24_4_ = 0x60;
      auVar31._28_4_ = 0x60;
      local_e0 = vblendvps_avx(auVar31,auVar21,auVar5);
      auVar11 = ZEXT832(0) << 0x20;
      auVar5 = vcmpps_avx(local_120,auVar11,5);
      auVar15._8_4_ = 0x80;
      auVar15._0_8_ = 0x8000000080;
      auVar15._12_4_ = 0x80;
      auVar15._16_4_ = 0x80;
      auVar15._20_4_ = 0x80;
      auVar15._24_4_ = 0x80;
      auVar15._28_4_ = 0x80;
      auVar22._8_4_ = 0xa0;
      auVar22._0_8_ = 0xa0000000a0;
      auVar22._12_4_ = 0xa0;
      auVar22._16_4_ = 0xa0;
      auVar22._20_4_ = 0xa0;
      auVar22._24_4_ = 0xa0;
      auVar22._28_4_ = 0xa0;
      local_c0 = vblendvps_avx(auVar22,auVar15,auVar5);
      auVar5 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar11);
      auVar13 = vpmovsxwd_avx(auVar4);
      auVar4 = vpunpckhwd_avx(auVar4,auVar4);
      auVar10._16_16_ = auVar4;
      auVar10._0_16_ = auVar13;
      auVar16._8_4_ = 0x7f800000;
      auVar16._0_8_ = 0x7f8000007f800000;
      auVar16._12_4_ = 0x7f800000;
      auVar16._16_4_ = 0x7f800000;
      auVar16._20_4_ = 0x7f800000;
      auVar16._24_4_ = 0x7f800000;
      auVar16._28_4_ = 0x7f800000;
      local_a0 = vblendvps_avx(auVar16,auVar5,auVar10);
      auVar5 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar11);
      auVar12._8_4_ = 0xff800000;
      auVar12._0_8_ = 0xff800000ff800000;
      auVar12._12_4_ = 0xff800000;
      auVar12._16_4_ = 0xff800000;
      auVar12._20_4_ = 0xff800000;
      auVar12._24_4_ = 0xff800000;
      auVar12._28_4_ = 0xff800000;
      local_80 = vblendvps_avx(auVar12,auVar5,auVar10);
      local_1c0 = auVar1;
      local_1a0 = auVar2;
      local_180 = auVar3;
      do {
        k = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> k & 1) == 0; k = k + 1) {
          }
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,(Precalculations *)&local_3c0,ray,
                   (TravRayK<8,_true> *)&local_220.field_0,context);
        uVar9 = uVar9 & uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }